

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.hpp
# Opt level: O1

void __thiscall VariableSymbol::~VariableSymbol(VariableSymbol *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_Symbol)._vptr_Symbol = (_func_int **)&PTR__VariableSymbol_001f4678;
  pcVar2 = (this->name_)._M_dataplus._M_p;
  paVar1 = &(this->name_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x30);
  return;
}

Assistant:

VariableSymbol(const std::string& name, const TypeName& type):
    name_(name), type_(type) {}